

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmfilegen.cpp
# Opt level: O0

CommandOptions * CreateLargeFile(CommandOptions *Options)

{
  ui32_t uVar1;
  int iVar2;
  ui32_t uVar3;
  byte_t *pbVar4;
  uint *puVar5;
  long in_RSI;
  bool bVar6;
  Result_t local_228 [108];
  undefined1 local_1bc [8];
  CTR_Setup counter;
  ByteString local_70 [8];
  ByteString FB;
  FileWriter local_58 [8];
  FileWriter Writer;
  ui32_t write_count;
  ui32_t write_total;
  CommandOptions *Options_local;
  Result_t *result;
  
  Kumu::FileWriter::FileWriter(local_58);
  Kumu::ByteString::ByteString(local_70);
  Kumu::ByteString::Capacity((int)&counter + 0xcc);
  Kumu::Result_t::~Result_t((Result_t *)&counter.m_ctr);
  uVar1 = Kumu::ByteString::Capacity(local_70);
  if (uVar1 != 0x100000) {
    __assert_fail("FB.Capacity() == Megabyte",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/kmfilegen.cpp"
                  ,0x12e,"Result_t CreateLargeFile(CommandOptions &)");
  }
  fprintf(_stderr,"Writing %u chunks:\n",(ulong)*(uint *)(in_RSI + 0x58));
  s_Nonce = *(ui32_t *)(in_RSI + 0x58);
  counter.m_nonce._3_1_ = 0;
  Kumu::FileWriter::OpenWrite((string *)Options);
  while( true ) {
    iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
    bVar6 = false;
    if (-1 < iVar2) {
      bVar6 = *(int *)(in_RSI + 0x58) != 0;
    }
    if (!bVar6) break;
    iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
    if (-1 < iVar2) {
      CTR_Setup::CTR_Setup((CTR_Setup *)local_1bc);
      pbVar4 = Kumu::ByteString::Data(local_70);
      CTR_Setup::SetupWrite((CTR_Setup *)local_1bc,pbVar4);
      pbVar4 = Kumu::ByteString::Data(local_70);
      uVar1 = CTR_Setup::WriteSize((CTR_Setup *)local_1bc);
      uVar3 = CTR_Setup::WriteSize((CTR_Setup *)local_1bc);
      CTR_Setup::FillRandom((CTR_Setup *)local_1bc,pbVar4 + uVar1,0x100000 - uVar3);
      puVar5 = (uint *)Kumu::ByteString::RoData(local_70);
      Kumu::FileWriter::Write((uchar *)local_228,(uint)local_58,puVar5);
      Kumu::Result_t::operator=((Result_t *)Options,local_228);
      Kumu::Result_t::~Result_t(local_228);
      __assert_fail("write_count == Megabyte",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/kmfilegen.cpp"
                    ,0x13c,"Result_t CreateLargeFile(CommandOptions &)");
    }
  }
  fputs("\n",_stderr);
  counter.m_nonce._3_1_ = 1;
  Kumu::ByteString::~ByteString(local_70);
  Kumu::FileWriter::~FileWriter(local_58);
  return Options;
}

Assistant:

Result_t
CreateLargeFile(CommandOptions& Options)
{
  ui32_t write_total = 0;
  ui32_t write_count = 0;
  FileWriter  Writer;
  ByteString  FB;

  FB.Capacity(Megabyte);
  assert(FB.Capacity() == Megabyte);

  fprintf(stderr, "Writing %u chunks:\n", Options.chunk_count);
  s_Nonce = Options.chunk_count;
  Result_t result = Writer.OpenWrite(Options.filename);

  while ( KM_SUCCESS(result) && write_total < Options.chunk_count )
    {
      if ( KM_SUCCESS(result))
	{
	  CTR_Setup counter;
	  counter.SetupWrite(FB.Data());
	  counter.FillRandom(FB.Data() + counter.WriteSize(), Megabyte - counter.WriteSize());
	  result = Writer.Write(FB.RoData(), Megabyte, &write_count);
	  assert(write_count == Megabyte);
	  fprintf(stderr, "\r%8u ", ++write_total);
	}
    }
  
  fputs("\n", stderr);

  return result;
}